

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncError xmlCharEncInput(xmlParserInputBufferPtr input,size_t *sizeOut,int flush)

{
  xmlBufPtr pxVar1;
  xmlCharEncodingHandler *handler;
  ulong uVar2;
  xmlCharEncError xVar3;
  int iVar4;
  size_t sVar5;
  xmlChar *in;
  size_t sVar6;
  xmlChar *out;
  unsigned_long uVar7;
  char cVar8;
  size_t sVar9;
  byte bVar10;
  long lVar11;
  int c_in;
  int c_out;
  xmlParserInputBufferPtr local_78;
  uchar *local_70;
  int local_64;
  size_t local_60;
  ulong local_58;
  xmlBufPtr local_50;
  xmlBufPtr local_48;
  size_t *local_40;
  ulong local_38;
  
  local_50 = input->buffer;
  pxVar1 = input->raw;
  sVar9 = *sizeOut;
  *sizeOut = 0;
  local_78 = input;
  sVar5 = xmlBufUse(pxVar1);
  in = (uchar *)0x0;
  if (flush != 0 || sVar5 != 0) {
    local_64 = flush;
    local_48 = pxVar1;
    local_40 = sizeOut;
    in = xmlBufContent(pxVar1);
    local_58 = 0;
    local_60 = 0;
LAB_00129c62:
    pxVar1 = local_50;
    local_70 = (uchar *)CONCAT71(local_70._1_7_,local_64 != 0);
    sVar6 = xmlBufAvail(local_50);
    if (0x3ffffffe < sVar6) {
      sVar6 = 0x3fffffff;
    }
    c_out = (int)sVar9;
    if (sVar6 < sVar9) {
      c_out = (int)sVar6;
    }
    c_in = 0x3fffffff;
    if (sVar5 < 0x40000000) {
      c_in = (int)sVar5;
    }
    handler = local_78->encoder;
    local_38 = sVar9;
    out = xmlBufEnd(pxVar1);
    bVar10 = sVar5 < 0x40000000 & (byte)local_70;
    local_70 = in;
    xVar3 = xmlEncInputChunk(handler,out,&c_out,in,&c_in,(uint)bVar10);
    in = (xmlChar *)(ulong)(uint)xVar3;
    lVar11 = (long)c_in;
    sVar9 = (size_t)c_out;
    xmlBufAddLen(pxVar1,sVar9);
    uVar2 = local_38;
    switch(xVar3) {
    case XML_ENC_ERR_MEMORY:
switchD_00129d1e_caseD_fffffffc:
      iVar4 = 2;
      break;
    case XML_ENC_ERR_SPACE:
    case XML_ENC_ERR_SUCCESS:
      local_58 = local_58 + lVar11;
      local_60 = local_60 + sVar9;
      if ((sVar5 < 0x40000000) && (local_38 <= sVar6)) goto LAB_00129d9d;
      cVar8 = (xVar3 == XML_ENC_ERR_SUCCESS && sVar5 < 0x40000000 ||
              xVar3 == XML_ENC_ERR_SPACE && local_38 <= sVar6) * '\x03';
      if (((xVar3 != XML_ENC_ERR_SUCCESS || sVar5 >= 0x40000000) &&
           (xVar3 != XML_ENC_ERR_SPACE || local_38 > sVar6)) && (xVar3 == XML_ENC_ERR_SPACE)) {
        iVar4 = xmlBufGrow(local_50,0x1000);
        cVar8 = '\0';
        if (iVar4 < 0) {
          in = (uchar *)0xfffffffc;
          goto switchD_00129d1e_caseD_fffffffc;
        }
      }
      in = local_70 + lVar11;
      sVar5 = sVar5 - lVar11;
      sVar9 = uVar2 - sVar9;
      if (cVar8 != '\0') goto code_r0x00129d98;
      goto LAB_00129c62;
    case XML_ENC_ERR_INPUT:
      iVar4 = 0x51;
      break;
    default:
      iVar4 = 1;
    }
    local_78->error = iVar4;
  }
LAB_00129dee:
  return (xmlCharEncError)in;
code_r0x00129d98:
  if (cVar8 == '\x03') {
LAB_00129d9d:
    uVar2 = local_58;
    xmlBufShrink(local_48,local_58);
    uVar7 = 0xffffffffffffffff;
    if (!CARRY8(uVar2,local_78->rawconsumed)) {
      uVar7 = uVar2 + local_78->rawconsumed;
    }
    local_78->rawconsumed = uVar7;
    *local_40 = local_60;
    in = (uchar *)0x0;
  }
  goto LAB_00129dee;
}

Assistant:

xmlCharEncError
xmlCharEncInput(xmlParserInputBufferPtr input, size_t *sizeOut, int flush)
{
    xmlBufPtr out, in;
    const xmlChar *dataIn;
    size_t availIn;
    size_t maxOut;
    size_t totalIn, totalOut;
    xmlCharEncError ret;

    out = input->buffer;
    in = input->raw;

    maxOut = *sizeOut;
    totalOut = 0;

    *sizeOut = 0;

    availIn = xmlBufUse(in);
    if ((availIn == 0) && (!flush))
        return(0);
    dataIn = xmlBufContent(in);
    totalIn = 0;

    while (1) {
        size_t availOut;
        int completeOut, completeIn;
        int c_out, c_in;

        availOut = xmlBufAvail(out);
        if (availOut > INT_MAX / 2)
            availOut = INT_MAX / 2;

        if (availOut < maxOut) {
            c_out = availOut;
            completeOut = 0;
        } else {
            c_out = maxOut;
            completeOut = 1;
        }

        if (availIn > INT_MAX / 2) {
            c_in = INT_MAX / 2;
            completeIn = 0;
        } else {
            c_in = availIn;
            completeIn = 1;
        }

        ret = xmlEncInputChunk(input->encoder, xmlBufEnd(out), &c_out,
                               dataIn, &c_in, flush && completeIn);

        totalIn += c_in;
        dataIn += c_in;
        availIn -= c_in;

        totalOut += c_out;
        maxOut -= c_out;
        xmlBufAddLen(out, c_out);

        if ((ret != XML_ENC_ERR_SUCCESS) && (ret != XML_ENC_ERR_SPACE)) {
            input->error = xmlEncConvertError(ret);
            return(ret);
        }

        if ((completeOut) && (completeIn))
            break;
        if ((completeOut) && (ret == XML_ENC_ERR_SPACE))
            break;
        if ((completeIn) && (ret == XML_ENC_ERR_SUCCESS))
            break;

        if (ret == XML_ENC_ERR_SPACE) {
            if (xmlBufGrow(out, 4096) < 0) {
                input->error = XML_ERR_NO_MEMORY;
                return(XML_ENC_ERR_MEMORY);
            }
        }
    }

    xmlBufShrink(in, totalIn);

    if (input->rawconsumed > ULONG_MAX - (unsigned long) totalIn)
        input->rawconsumed = ULONG_MAX;
    else
        input->rawconsumed += totalIn;

    *sizeOut = totalOut;
    return(XML_ENC_ERR_SUCCESS);
}